

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Registry *this,Network *aRet)

{
  Status SVar1;
  int iVar2;
  NetworkId networkId;
  NetworkId local_7c;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  undefined6 local_50;
  undefined2 uStack_4a;
  undefined6 uStack_48;
  _Alloc_hider local_40;
  char local_30 [16];
  int local_20;
  
  if (this->mStorage == (PersistentStorage *)0x0) {
    __assert_fail("mStorage != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry.cpp"
                  ,0x23c,
                  "Registry::Status ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Network &)"
                 );
  }
  NetworkId::NetworkId(&local_7c);
  iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x1d])(this->mStorage,&local_7c);
  SVar1 = kError;
  if ((char)iVar2 == '\0') {
    if (local_7c.mId == 0xffffffff) {
      Network::Network((Network *)local_78);
      aRet->mId = (NetworkId)local_78._0_4_;
      aRet->mDomainId = (DomainId)local_78._4_4_;
      std::__cxx11::string::operator=((string *)&aRet->mName,(string *)&local_70);
      aRet->mXpan = CONCAT26(uStack_4a,local_50);
      *(ulong *)((long)&aRet->mXpan + 6) = CONCAT62(uStack_48,uStack_4a);
      std::__cxx11::string::operator=((string *)&aRet->mMlp,(string *)&local_40);
      aRet->mCcm = local_20;
      if (local_40._M_p != local_30) {
        operator_delete(local_40._M_p);
      }
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      SVar1 = kSuccess;
    }
    else {
      iVar2 = (*this->mStorage->_vptr_PersistentStorage[0xe])(this->mStorage,&local_7c,aRet);
      SVar1 = kNotFound;
      if ((char)iVar2 != '\x01') {
        SVar1 = ((char)iVar2 != '\0') << 2;
      }
    }
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetCurrentNetwork(Network &aRet)
{
    assert(mStorage != nullptr);
    NetworkId networkId;
    if (MapStatus(mStorage->GetCurrentNetwork(networkId)) != Registry::Status::kSuccess)
    {
        return Registry::Status::kError;
    }

    return (networkId.mId == EMPTY_ID) ? (aRet = Network{}, Registry::Status::kSuccess)
                                       : MapStatus(mStorage->Get(networkId, aRet));
}